

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O0

GMM_STATUS
GmmTexGetMipMapOffset
          (GMM_TEXTURE_INFO *pTexInfo,GMM_REQ_OFFSET_INFO *pReqInfo,GMM_LIB_CONTEXT *pGmmLibContext)

{
  int iVar1;
  GMM_STATUS GVar2;
  GMM_TEXTURE_CALC *this;
  bool bVar3;
  GMM_TEXTURE_CALC *pTextureCalc;
  bool RestoreLockReq;
  bool RestoreRenderReq;
  GMM_STATUS Status;
  GMM_LIB_CONTEXT *pGmmLibContext_local;
  GMM_REQ_OFFSET_INFO *pReqInfo_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  
  pTextureCalc._4_4_ = GMM_SUCCESS;
  bVar3 = false;
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    pTexInfo_local._4_4_ = GMM_ERROR;
  }
  else if (pReqInfo == (GMM_REQ_OFFSET_INFO *)0x0) {
    pTexInfo_local._4_4_ = GMM_ERROR;
  }
  else {
    this = GmmGetTextureCalc(pGmmLibContext);
    if ((((int)pReqInfo->Plane < 4) && (-1 < (int)pReqInfo->Plane)) && (pReqInfo->MipLevel < 0xf)) {
      if (((int)pTexInfo->TileMode < 0x6d) && (-1 < (int)pTexInfo->TileMode)) {
        if ((*(uint *)pReqInfo >> 1 & 1) != 0) {
          bVar3 = ((undefined1  [96])*pReqInfo & (undefined1  [96])0x1) != (undefined1  [96])0x0;
          if (bVar3) {
            *(uint *)pReqInfo = *(uint *)pReqInfo & 0xfffffffe;
          }
          iVar1 = (*this->_vptr_GmmTextureCalc[0xf])(this,pTexInfo,pReqInfo);
          pTextureCalc._4_4_ = (GMM_STATUS)(iVar1 != 0);
        }
        if (bVar3) {
          *(uint *)pReqInfo = *(uint *)pReqInfo & 0xfffffffe | 1;
        }
        bVar3 = (*(uint *)pReqInfo >> 1 & 1) != 0;
        if (bVar3) {
          *(uint *)pReqInfo = *(uint *)pReqInfo & 0xfffffffd;
        }
        if ((((undefined1  [96])*pReqInfo & (undefined1  [96])0x1) != (undefined1  [96])0x0) &&
           (GVar2 = GmmLib::GmmTextureCalc::GetTexRenderOffset(this,pTexInfo,pReqInfo),
           GVar2 != GMM_SUCCESS)) {
          pTextureCalc._4_4_ = GMM_ERROR;
        }
        if (bVar3) {
          *(uint *)pReqInfo = *(uint *)pReqInfo & 0xfffffffd | 2;
        }
        if (((*(uint *)pReqInfo >> 2 & 1) != 0) &&
           (GVar2 = GmmLib::GmmTextureCalc::GetTexStdLayoutOffset(this,pTexInfo,pReqInfo),
           GVar2 != GMM_SUCCESS)) {
          pTextureCalc._4_4_ = GMM_ERROR;
        }
        pTexInfo_local._4_4_ = pTextureCalc._4_4_;
      }
      else {
        pTexInfo_local._4_4_ = GMM_ERROR;
      }
    }
    else {
      pTexInfo_local._4_4_ = GMM_ERROR;
    }
  }
  return pTexInfo_local._4_4_;
}

Assistant:

GMM_STATUS GmmTexGetMipMapOffset(GMM_TEXTURE_INFO *   pTexInfo,
                                 GMM_REQ_OFFSET_INFO *pReqInfo,
                                 GMM_LIB_CONTEXT *    pGmmLibContext)
{
    GMM_STATUS        Status           = GMM_SUCCESS;
    bool              RestoreRenderReq = false;
    bool              RestoreLockReq   = false;
    GMM_TEXTURE_CALC *pTextureCalc;

    GMM_DPF_ENTER;
    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pReqInfo, GMM_ERROR);
    __GMM_ASSERT(pReqInfo->CubeFace <= __GMM_NO_CUBE_MAP);

    pTextureCalc = GMM_OVERRIDE_TEXTURE_CALC(pTexInfo, pGmmLibContext);

    if((pReqInfo->Plane >= GMM_MAX_PLANE) ||
       (pReqInfo->Plane < GMM_NO_PLANE) ||
       (pReqInfo->MipLevel >= GMM_MAX_MIPMAP))
    {
        GMM_ASSERTDPF(0, "Invalid parameter!");
        return GMM_ERROR;
    }

    if((pTexInfo->TileMode >= GMM_TILE_MODES) ||
       (pTexInfo->TileMode < TILE_NONE))
    {
        GMM_ASSERTDPF(0, "Invalid parameter!");
        return GMM_ERROR;
    }

    // Retrieve offset info at pReqInfo->MipLevel
    if(pReqInfo->ReqLock)
    {
        if(pReqInfo->ReqRender)
        {
            pReqInfo->ReqRender = 0;
            RestoreRenderReq    = true;
        }

        if(pTextureCalc->GetTexLockOffset(pTexInfo, pReqInfo) != GMM_SUCCESS)
        {
            GMM_ASSERTDPF(0, "ReqLock failed!");
            Status = GMM_ERROR;
        }
    }

    if(RestoreRenderReq == true)
        pReqInfo->ReqRender = 1;

    if(pReqInfo->ReqLock)
    {
        pReqInfo->ReqLock = 0;
        RestoreLockReq    = 1;
    }

    if(pReqInfo->ReqRender)
    {
        if(pTextureCalc->GetTexRenderOffset(pTexInfo, pReqInfo) != GMM_SUCCESS)
        {
            GMM_ASSERTDPF(0, "ReqRender failed!");
            Status = GMM_ERROR;
        }
    }
    
    if(RestoreLockReq)
    {
        pReqInfo->ReqLock = 1;
    }
    
    if(pReqInfo->ReqStdLayout)
    {
        if(pTextureCalc->GetTexStdLayoutOffset(pTexInfo, pReqInfo) != GMM_SUCCESS)
        {
            GMM_ASSERTDPF(0, "ReqStdLayout failed!");
            Status = GMM_ERROR;
        }
    }

    GMM_DPF_EXIT;
    return Status;
}